

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_suite.cpp
# Opt level: O0

void from_suite::convert_vector_double(void)

{
  initializer_list<double> __l;
  allocator<double> *this;
  vector<double,_std::allocator<double>_> *u;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_228;
  iterator local_210;
  iterator local_1f8;
  iterator local_1e0;
  iterator local_1c8;
  basic_variable<std::allocator<char>_> *local_1b0;
  basic_variable<std::allocator<char>_> local_1a8;
  basic_variable<std::allocator<char>_> local_178;
  basic_variable<std::allocator<char>_> local_148;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_e8 [24];
  variable expect;
  variable result;
  allocator<double> local_59;
  double local_58 [5];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<double,_std::allocator<double>_> input;
  
  local_58[2] = 3.0;
  local_58[3] = 4.0;
  local_58[0] = 1.0;
  local_58[1] = 2.0;
  local_30 = local_58;
  local_28 = 4;
  this = &local_59;
  std::allocator<double>::allocator(this);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_20,__l,(allocator_type *)this);
  std::allocator<double>::~allocator(&local_59);
  trial::dynamic::convert::
  into<trial::dynamic::basic_variable<std::allocator<char>>,std::vector<double,std::allocator<double>>>
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28,(convert *)local_20
             ,u);
  local_1b0 = &local_1a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1b0,1.0);
  local_1b0 = &local_178;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1b0,2.0);
  local_1b0 = &local_148;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1b0,3.0);
  local_1b0 = &local_118;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1b0,4.0);
  local_e8._0_8_ = &local_1a8;
  local_e8._8_8_ = 4;
  init._M_len = (size_type)this;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_e8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_e8._0_8_,init);
  local_228 = (basic_variable<std::allocator<char>_> *)local_e8;
  do {
    local_228 = local_228 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_228);
  } while (local_228 != &local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c8,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e0,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1f8,(basic_variable<std::allocator<char>_> *)(local_e8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_210,(basic_variable<std::allocator<char>_> *)(local_e8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/std/vector_suite.cpp"
             ,0x28,"void from_suite::convert_vector_double()",&local_1c8,&local_1e0,&local_1f8,
             &local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_e8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_20);
  return;
}

Assistant:

void convert_vector_double()
{
    std::vector<double> input = { 1.0, 2.0, 3.0, 4.0 };
    variable result = convert::into<variable>(input);

    variable expect = array::make({ 1.0, 2.0, 3.0, 4.0 });
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}